

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  int iVar1;
  ostream *poVar2;
  GLint GVar3;
  TransientContextLock lock;
  TextureSaver save;
  TransientContextLock local_2d;
  TextureSaver local_2c;
  
  if ((this->m_isRepeated != repeated) && (this->m_isRepeated = repeated, this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_2d);
    priv::TextureSaver::TextureSaver(&local_2c);
    if (setRepeated(bool)::textureEdgeClamp == '\0') {
      iVar1 = __cxa_guard_acquire(&setRepeated(bool)::textureEdgeClamp);
      if (iVar1 != 0) {
        setRepeated::textureEdgeClamp = SF_GLAD_GL_SGIS_texture_edge_clamp != 0;
        __cxa_guard_release(&setRepeated(bool)::textureEdgeClamp);
      }
    }
    if (((this->m_isRepeated == false) && (setRepeated::textureEdgeClamp == false)) &&
       (setRepeated(bool)::warned == '\0')) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"OpenGL extension SGIS_texture_edge_clamp unavailable");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Artifacts may occur along texture edges");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available");
      std::endl<char,std::char_traits<char>>(poVar2);
      setRepeated(bool)::warned = '\x01';
    }
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    GVar3 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      GVar3 = 0x812f;
    }
    if (this->m_isRepeated != false) {
      GVar3 = 0x2901;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2802,GVar3);
    GVar3 = 0x2900;
    if ((setRepeated::textureEdgeClamp & 1U) != 0) {
      GVar3 = 0x812f;
    }
    if (this->m_isRepeated != false) {
      GVar3 = 0x2901;
    }
    (*sf_glad_glTexParameteri)(0xde1,0x2803,GVar3);
    priv::TextureSaver::~TextureSaver(&local_2c);
    GlResource::TransientContextLock::~TransientContextLock(&local_2d);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}